

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt32::read
          (PLYValueBigUInt32 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = std::streambuf::sbumpc();
  this->value = iVar2 << 0x18;
  bVar1 = std::streambuf::sbumpc();
  this->value = this->value | (uint)bVar1 << 0x10;
  uVar3 = std::streambuf::sbumpc();
  this->value = this->value | (uVar3 & 0xff) << 8;
  bVar1 = std::streambuf::sbumpc();
  this->value = this->value | (uint)bVar1;
  return (ulong)bVar1;
}

Assistant:

void read(std::streambuf *in)
    {
      value=(in->sbumpc()&0xff)<<24;
      value|=(in->sbumpc()&0xff)<<16;
      value|=(in->sbumpc()&0xff)<<8;
      value|=in->sbumpc()&0xff;
    }